

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall Scene::~Scene(Scene *this)

{
  Camera *this_00;
  bool bVar1;
  reference ppLVar2;
  reference ppOVar3;
  Object *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Object_*,_std::allocator<Object_*>_> *__range1_1;
  Light *i;
  iterator __end1;
  iterator __begin1;
  vector<Light_*,_std::allocator<Light_*>_> *__range1;
  Scene *this_local;
  
  if ((this->m_camera != (Camera *)0x0) && (this_00 = this->m_camera, this_00 != (Camera *)0x0)) {
    Camera::~Camera(this_00);
    operator_delete(this_00);
  }
  __end1 = std::vector<Light_*,_std::allocator<Light_*>_>::begin(&this->m_lights);
  i = (Light *)std::vector<Light_*,_std::allocator<Light_*>_>::end(&this->m_lights);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>
                                     *)&i), bVar1) {
    ppLVar2 = __gnu_cxx::
              __normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
              operator*(&__end1);
    if (*ppLVar2 != (Light *)0x0) {
      (*(*ppLVar2)->_vptr_Light[1])();
    }
    __gnu_cxx::__normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<Object_*,_std::allocator<Object_*>_>::begin(&this->m_objects);
  i_1 = (Object *)std::vector<Object_*,_std::allocator<Object_*>_>::end(&this->m_objects);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                             *)&i_1), bVar1) {
    ppOVar3 = __gnu_cxx::
              __normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>::
              operator*(&__end1_1);
    if (*ppOVar3 != (Object *)0x0) {
      (*(*ppOVar3)->_vptr_Object[1])();
    }
    __gnu_cxx::__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>::
    operator++(&__end1_1);
  }
  std::vector<Light_*,_std::allocator<Light_*>_>::clear(&this->m_lights);
  std::vector<Object_*,_std::allocator<Object_*>_>::clear(&this->m_objects);
  std::vector<Object_*,_std::allocator<Object_*>_>::~vector(&this->m_objects);
  std::vector<Light_*,_std::allocator<Light_*>_>::~vector(&this->m_lights);
  return;
}

Assistant:

Scene::~Scene()
{
    if (m_camera) delete m_camera;
    for (auto i : m_lights) delete i;
    for (auto i : m_objects) delete i;
    m_lights.clear();
    m_objects.clear();
}